

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O0

int __thiscall
FormatTypeDSK::LoadDisk
          (FormatTypeDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  IDisk *this_00;
  ulong uVar6;
  Track *pTVar7;
  void *__dest;
  Sector *pSVar8;
  uchar *puVar9;
  MFMTrack *pMVar10;
  undefined8 *puVar11;
  anon_struct_48_3_f145af35 *local_d8;
  anon_struct_48_3_f145af35 *local_b8;
  uint local_ac;
  uint local_90;
  uint local_8c;
  uint track_1;
  uint track;
  int side;
  uint offset;
  uchar sector_size;
  uint tn;
  uchar *header;
  int index_buffer;
  uchar *track_block;
  uint k;
  int j;
  int i;
  int size_of_track;
  int nb_tracks;
  IDisk *new_disk;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  size_t size_local;
  uchar *buffer_local;
  FormatTypeDSK *this_local;
  
  if (*(long *)buffer == 0x435043202d20564d) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[0x30];
    this_00->nb_sides_ = buffer[0x31];
    if (2 < this_00->nb_sides_) {
      this_00->nb_sides_ = '\x02';
    }
    iVar4 = (uint)buffer[0x32] + (uint)buffer[0x33] * 0x100 + -0x100;
    for (k = 0; (int)k < (int)(uint)this_00->nb_sides_; k = k + 1) {
      this->side_[(int)k].nb_tracks = bVar1;
      auVar3 = ZEXT116(this->side_[(int)k].nb_tracks) * ZEXT816(0x28);
      uVar6 = auVar3._0_8_;
      if (auVar3._8_8_ != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pTVar7 = (Track *)operator_new__(uVar6);
      this->side_[(int)k].tracks = pTVar7;
      memset(this->side_[(int)k].tracks,0,(ulong)this->side_[(int)k].nb_tracks * 0x28);
    }
    __dest = operator_new__((long)iVar4);
    header._4_4_ = 0x100;
    for (track_block._4_4_ = 0; track_block._4_4_ < (int)((uint)bVar1 * (uint)this_00->nb_sides_);
        track_block._4_4_ = track_block._4_4_ + 1) {
      uVar5 = (uint)buffer[(long)header._4_4_ + 0x11];
      memcpy(__dest,buffer + (header._4_4_ + 0x100),(long)iVar4);
      offset = (uint)buffer[(long)header._4_4_ + 0x10];
      if (this->side_[(int)uVar5].nb_tracks <= offset) {
        offset = this->side_[(int)uVar5].nb_tracks - 1;
      }
      bVar2 = buffer[(long)header._4_4_ + 0x14];
      this->side_[(int)uVar5].tracks[offset].sz = bVar2;
      this->side_[(int)uVar5].tracks[offset].sector_size = 0x80 << (bVar2 & 0x1f);
      this->side_[(int)uVar5].tracks[offset].nb_sector = (uint)buffer[(long)header._4_4_ + 0x15];
      this->side_[(int)uVar5].tracks[offset].gap3 = buffer[(long)header._4_4_ + 0x16];
      this->side_[(int)uVar5].tracks[offset].gap3_filter = 'N';
      auVar3 = ZEXT416(this->side_[(int)uVar5].tracks[offset].nb_sector) * ZEXT816(0x18);
      uVar6 = auVar3._0_8_;
      if (auVar3._8_8_ != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pSVar8 = (Sector *)operator_new__(uVar6);
      this->side_[(int)uVar5].tracks[offset].sectors = pSVar8;
      for (track_block._0_4_ = 0;
          (uint)track_block < this->side_[(int)uVar5].tracks[offset].nb_sector;
          track_block._0_4_ = (uint)track_block + 1) {
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].track =
             buffer[(ulong)((uint)track_block * 8 + 0x18) + (long)header._4_4_];
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].side =
             buffer[(ulong)((uint)track_block * 8 + 0x19) + (long)header._4_4_];
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].sector_id =
             buffer[(ulong)((uint)track_block * 8 + 0x1a) + (long)header._4_4_];
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].sector_size =
             buffer[(ulong)((uint)track_block * 8 + 0x1b) + (long)header._4_4_];
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].fdc_status_1 =
             buffer[(ulong)((uint)track_block * 8 + 0x1c) + (long)header._4_4_];
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].fdc_status_2 =
             buffer[(ulong)((uint)track_block * 8 + 0x1d) + (long)header._4_4_];
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].actual_size =
             (unsigned_short)this->side_[(int)uVar5].tracks[offset].sector_size;
      }
      track = 0;
      for (track_block._0_4_ = 0;
          (uint)track_block < this->side_[(int)uVar5].tracks[offset].nb_sector;
          track_block._0_4_ = (uint)track_block + 1) {
        puVar9 = (uchar *)operator_new__((ulong)this->side_[(int)uVar5].tracks[offset].sector_size);
        this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].data = puVar9;
        memcpy(this->side_[(int)uVar5].tracks[offset].sectors[(uint)track_block].data,
               (void *)((long)__dest + (ulong)track),
               (ulong)this->side_[(int)uVar5].tracks[offset].sector_size);
        track = this->side_[(int)uVar5].tracks[offset].sector_size + track;
      }
      header._4_4_ = iVar4 + header._4_4_ + 0x100;
    }
    if (__dest != (void *)0x0) {
      operator_delete__(__dest);
    }
    for (track_1 = 0; (int)track_1 < (int)(uint)this_00->nb_sides_; track_1 = track_1 + 1) {
      if (this->side_[(int)track_1].nb_tracks < 0x2a) {
        local_ac = 0x2a;
      }
      else {
        local_ac = (uint)this->side_[(int)track_1].nb_tracks;
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(int)local_ac;
      uVar6 = SUB168(auVar3 * ZEXT816(0x20),0);
      if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pMVar10 = (MFMTrack *)operator_new__(uVar6);
      this_00->side_[(int)track_1].tracks = pMVar10;
      this_00->side_[(int)track_1].nb_tracks = (uint)this->side_[(int)track_1].nb_tracks;
      for (local_8c = 0; local_8c < this_00->side_[(int)track_1].nb_tracks; local_8c = local_8c + 1)
      {
        this_00->side_[(int)track_1].tracks[local_8c].nb_revolutions = 1;
        puVar11 = (undefined8 *)operator_new__(0x38);
        *puVar11 = 1;
        local_b8 = (anon_struct_48_3_f145af35 *)(puVar11 + 1);
        do {
          IDisk::anon_struct_48_3_f145af35::Revolution(local_b8);
          local_b8 = local_b8 + 1;
        } while (local_b8 != (anon_struct_48_3_f145af35 *)(puVar11 + 7));
        this_00->side_[(int)track_1].tracks[local_8c].revolution = (Revolution *)(puVar11 + 1);
        uVar5 = FillTrack(this,(uchar *)0x0,track_1,local_8c);
        (this_00->side_[(int)track_1].tracks[local_8c].revolution)->size = uVar5;
        if ((this_00->side_[(int)track_1].tracks[local_8c].revolution)->size < 0x40000) {
          puVar9 = (uchar *)operator_new__(0x40000);
          (this_00->side_[(int)track_1].tracks[local_8c].revolution)->bitfield = puVar9;
        }
        else {
          puVar9 = (uchar *)operator_new__((ulong)(this_00->side_[(int)track_1].tracks[local_8c].
                                                  revolution)->size);
          (this_00->side_[(int)track_1].tracks[local_8c].revolution)->bitfield = puVar9;
        }
        memset((this_00->side_[(int)track_1].tracks[local_8c].revolution)->bitfield,0,
               (ulong)(this_00->side_[(int)track_1].tracks[local_8c].revolution)->size);
        FillTrack(this,(this_00->side_[(int)track_1].tracks[local_8c].revolution)->bitfield,track_1,
                  local_8c);
      }
      if (this_00->side_[(int)track_1].nb_tracks < 0x2a) {
        for (local_90 = this_00->side_[(int)track_1].nb_tracks; local_90 < 0x2a;
            local_90 = local_90 + 1) {
          this_00->side_[(int)track_1].tracks[local_90].nb_revolutions = 1;
          puVar11 = (undefined8 *)operator_new__(0x38);
          *puVar11 = 1;
          local_d8 = (anon_struct_48_3_f145af35 *)(puVar11 + 1);
          do {
            IDisk::anon_struct_48_3_f145af35::Revolution(local_d8);
            local_d8 = local_d8 + 1;
          } while (local_d8 != (anon_struct_48_3_f145af35 *)(puVar11 + 7));
          this_00->side_[(int)track_1].tracks[local_90].revolution = (Revolution *)(puVar11 + 1);
          (this_00->side_[(int)track_1].tracks[local_90].revolution)->size = 0x40000;
          puVar9 = (uchar *)operator_new__((ulong)(this_00->side_[(int)track_1].tracks[local_90].
                                                  revolution)->size);
          (this_00->side_[(int)track_1].tracks[local_90].revolution)->bitfield = puVar9;
          memset((this_00->side_[(int)track_1].tracks[local_90].revolution)->bitfield,0,0x40000);
        }
      }
    }
    (*this_00->_vptr_IDisk[0x14])();
    *created_disk = this_00;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int FormatTypeDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "MV - CPC", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Name of creator : don't read
      // Number of tracks, and sides
      int nb_tracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! Handle or correct ?
         new_disk->nb_sides_ = 2;
      }

      // Size of tracks
      int size_of_track = (buffer[0x32] + ((buffer[0x33]) << 8)) - 0x100;
      //m_NbSide = m_NbSide;

      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         side_[i].nb_tracks = nb_tracks;
         side_[i].tracks = new Track[side_[i].nb_tracks];
         memset(side_[i].tracks, 0, sizeof(Track) * side_[i].nb_tracks);
      }


      // Read the tracks
      unsigned char* track_block = new unsigned char[size_of_track];

      int index_buffer = 0x100;
      for (j = 0; j < nb_tracks * new_disk->nb_sides_; j++)
      {
         const unsigned char* header = &buffer[index_buffer];
         index_buffer += 0x100;

         //fread(header, 0x100, 1, file);
         // Side number
         i = header[0x11];

         //fread(TrackBlock, m_SizeOfTrack, 1, file);
         memcpy(track_block, &buffer[index_buffer], size_of_track);
         index_buffer += size_of_track;
         // Track number
         unsigned int tn = header[0x10];
         if (tn >= side_[i].nb_tracks)
         {
            // bug...
            tn = side_[i].nb_tracks - 1;
         }
         unsigned char sector_size = side_[i].tracks[tn].sz = header[0x14];
         //SZ = sectorSize_L;
         side_[i].tracks[tn].sector_size = (0x80 << sector_size);
         // Number of sector
         side_[i].tracks[tn].nb_sector = header[0x15];
         side_[i].tracks[tn].gap3 = header[0x16];
         side_[i].tracks[tn].gap3_filter = 0x4E; // header [0x17];
         side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
         // Sector info
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].track = header[0x18 + k * 8 + 00];
            side_[i].tracks[tn].sectors[k].side = header[0x18 + k * 8 + 01];
            side_[i].tracks[tn].sectors[k].sector_id = header[0x18 + k * 8 + 02];
            side_[i].tracks[tn].sectors[k].sector_size = header[0x18 + k * 8 + 03];
            side_[i].tracks[tn].sectors[k].fdc_status_1 = header[0x18 + k * 8 + 04];
            side_[i].tracks[tn].sectors[k].fdc_status_2 = header[0x18 + k * 8 + 05];

            side_[i].tracks[tn].sectors[k].actual_size = side_[i].tracks[tn].sector_size;
         }

         // Data
         unsigned int offset = 0;
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sector_size];
            memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset], side_[i].tracks[tn].sector_size);
            offset += side_[i].tracks[tn].sector_size;
         }
      }
      delete[]track_block;

      // Fill the MFM structure
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].tracks = new IDisk::MFMTrack[side_[side].nb_tracks < 42 ? 42 : side_[side].nb_tracks];
         new_disk->side_[side].nb_tracks = side_[side].nb_tracks;

         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Init space
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = FillTrack(NULL, side, track);
            if (new_disk->side_[side].tracks[track].revolution[0].size < DEFAULT_TRACK_SIZE * 16)
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            }
            else
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
            }
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0,
                   new_disk->side_[side].tracks[track].revolution[0].size);

            FillTrack(new_disk->side_[side].tracks[track].revolution[0].bitfield, side, track);
         }
         if (new_disk->side_[side].nb_tracks < 42)
         {
            for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
            {
               new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

               new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
            }
         }
      }
      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   return FILE_ERROR;
}